

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceField.cpp
# Opt level: O0

ifstrstream * __thiscall OpenMD::ForceField::openForceFieldFile(ForceField *this,string *filename)

{
  bool bVar1;
  ifstrstream *piVar2;
  char *pcVar3;
  undefined8 uVar4;
  string *in_RSI;
  ifstrstream *ffStream;
  string forceFieldFilename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  errorStruct *peVar5;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  ifstrstream *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  string local_88 [32];
  string local_68 [48];
  ifstrstream *local_38;
  string local_30 [48];
  
  std::__cxx11::string::string(local_30,in_RSI);
  piVar2 = (ifstrstream *)operator_new(0x278);
  ifstrstream::ifstrstream(in_stack_ffffffffffffff50);
  local_38 = piVar2;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  ifstrstream::open(piVar2,pcVar3,8,0);
  bVar1 = ifstrstream::is_open((ifstrstream *)0x1c38f0);
  if (!bVar1) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(bVar1,in_stack_ffffffffffffff58),(char *)in_stack_ffffffffffffff50);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
                   in_stack_ffffffffffffff30);
    std::__cxx11::string::operator=(local_30,local_68);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
    piVar2 = local_38;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    ifstrstream::open(piVar2,pcVar3,8,0);
    bVar1 = ifstrstream::is_open((ifstrstream *)0x1c39a6);
    if (!bVar1) {
      uVar4 = std::__cxx11::string::c_str();
      peVar5 = &painCave;
      snprintf(painCave.errMsg,2000,
               "Error opening the force field parameter file:\n\t%s\n\tHave you tried setting the FORCE_PARAM_PATH environment variable?\n"
               ,uVar4);
      peVar5->severity = 1;
      peVar5->isFatal = 1;
      simError();
    }
  }
  piVar2 = local_38;
  std::__cxx11::string::~string(local_30);
  return piVar2;
}

Assistant:

ifstrstream* ForceField::openForceFieldFile(const std::string& filename) {
    std::string forceFieldFilename(filename);

    ifstrstream* ffStream = new ifstrstream();

    // Try to open the force field file in current directory first
    ffStream->open(forceFieldFilename.c_str());

    if (!ffStream->is_open()) {
      // If current directory does not contain the force field file,
      // try to open it in ffPath_:
      forceFieldFilename = ffPath_ + "/" + forceFieldFilename;
      ffStream->open(forceFieldFilename.c_str());

      if (!ffStream->is_open()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Error opening the force field parameter file:\n"
                 "\t%s\n"
                 "\tHave you tried setting the FORCE_PARAM_PATH environment "
                 "variable?\n",
                 forceFieldFilename.c_str());
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      }
    }
    return ffStream;
  }